

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusnotifieritemadaptor.cpp
# Opt level: O0

void __thiscall
QStatusNotifierItemAdaptor::ProvideXdgActivationToken
          (QStatusNotifierItemAdaptor *this,QString *token)

{
  bool bVar1;
  QString *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff80;
  QByteArrayView local_50;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcTray();
  anon_unknown.dwarf_1fa2dd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1fa2dd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb3aa4a);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_RSI,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(char *)in_stack_ffffffffffffff78,
               (char *)0xb3aa60);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_RDI,in_RSI);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  QString::toUtf8((QString *)in_stack_ffffffffffffff78);
  QByteArrayView::QByteArrayView<QByteArray,_true>(in_RDI,(QByteArray *)in_RSI);
  qputenv("XDG_ACTIVATION_TOKEN",local_50);
  QByteArray::~QByteArray((QByteArray *)0xb3aad2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusNotifierItemAdaptor::ProvideXdgActivationToken(const QString &token)
{
    qCDebug(qLcTray) << token;
    qputenv("XDG_ACTIVATION_TOKEN", token.toUtf8());
}